

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool mz_zip_writer_init_file
                  (mz_zip_archive *pZip,char *pFilename,mz_uint64 size_to_reserve_at_beginning)

{
  mz_bool mVar1;
  FILE *pFVar2;
  size_t sVar3;
  mz_bool mVar4;
  size_t sVar5;
  mz_uint64 mVar6;
  char buf [4096];
  undefined1 auStack_1038 [4104];
  
  pZip->m_pWrite = (anonymous_namespace)::miniz::mz_zip_file_write_func;
  pZip->m_pIO_opaque = pZip;
  mVar1 = mz_zip_writer_init(pZip,size_to_reserve_at_beginning);
  mVar4 = 0;
  if (mVar1 != 0) {
    pFVar2 = fopen64(pFilename,"wb");
    if (pFVar2 == (FILE *)0x0) {
      mz_zip_writer_end(pZip);
      mVar4 = 0;
    }
    else {
      pZip->m_pState->m_pFile = (FILE *)pFVar2;
      mVar4 = 1;
      if (size_to_reserve_at_beginning != 0) {
        mVar6 = 0;
        memset(auStack_1038,0,0x1000);
        do {
          sVar5 = 0x1000;
          if (size_to_reserve_at_beginning < 0x1000) {
            sVar5 = size_to_reserve_at_beginning;
          }
          sVar3 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar6,auStack_1038,sVar5);
          if (sVar3 != sVar5) {
            mz_zip_writer_end(pZip);
            return 0;
          }
          mVar6 = mVar6 + sVar5;
          size_to_reserve_at_beginning = size_to_reserve_at_beginning - sVar5;
        } while (size_to_reserve_at_beginning != 0);
        mVar4 = 1;
      }
    }
  }
  return mVar4;
}

Assistant:

mz_bool mz_zip_writer_init_file(mz_zip_archive *pZip, const char *pFilename,
                                mz_uint64 size_to_reserve_at_beginning) {
  MZ_FILE *pFile;
  pZip->m_pWrite = mz_zip_file_write_func;
  pZip->m_pIO_opaque = pZip;
  if (!mz_zip_writer_init(pZip, size_to_reserve_at_beginning))
    return MZ_FALSE;
  if (NULL == (pFile = MZ_FOPEN(pFilename, "wb"))) {
    mz_zip_writer_end(pZip);
    return MZ_FALSE;
  }
  pZip->m_pState->m_pFile = pFile;
  if (size_to_reserve_at_beginning) {
    mz_uint64 cur_ofs = 0;
    char buf[4096];
    MZ_CLEAR_OBJ(buf);
    do {
      size_t n = (size_t)MZ_MIN(sizeof(buf), size_to_reserve_at_beginning);
      if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_ofs, buf, n) != n) {
        mz_zip_writer_end(pZip);
        return MZ_FALSE;
      }
      cur_ofs += n;
      size_to_reserve_at_beginning -= n;
    } while (size_to_reserve_at_beginning);
  }
  return MZ_TRUE;
}